

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
::
MapAllocator<std::_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
::deallocate(MapAllocator<std::_Rb_tree_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
             *this,pointer p,size_type n)

{
  if (this->arena_ != (Arena *)0x0) {
    return;
  }
  operator_delete(p,n * 0x28);
  return;
}

Assistant:

void deallocate(pointer p, size_type n) {
      if (arena_ == NULL) {
#if defined(__GXX_DELETE_WITH_SIZE__) || defined(__cpp_sized_deallocation)
        ::operator delete(p, n * sizeof(value_type));
#else
        ::operator delete(p);
#endif
      }
    }